

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O2

void mstl(double *x,int N,int *f,int *Nseas,int *s_window,double *lambda,int *iterate,
         double **seasonal,double *trend,double *remainder)

{
  double dVar1;
  uint uVar2;
  size_t __nmemb;
  double *y;
  int *pos;
  double *pdVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  size_t sVar9;
  uint N_00;
  void *pvVar10;
  int local_64;
  size_t sStack_60;
  int s_window_;
  uint *local_58;
  void *local_50;
  double *local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  
  if (s_window == (int *)0x0) {
    local_64 = 0xd;
  }
  else {
    local_64 = *s_window;
  }
  if (iterate == (int *)0x0) {
    local_34 = 2;
  }
  else {
    local_34 = *iterate;
  }
  __nmemb = (size_t)N;
  sVar9 = __nmemb * 8;
  local_58 = (uint *)Nseas;
  y = (double *)malloc(sVar9);
  sStack_60 = sVar9;
  if (lambda == (double *)0x0) {
    memcpy(y,x,sVar9);
  }
  else {
    boxcox(x,N,lambda,y);
  }
  uVar8 = *local_58;
  local_48 = (double *)malloc((long)(int)uVar8 << 3);
  uVar5 = 0;
  uVar7 = 0;
  if (0 < (int)uVar8) {
    uVar7 = (ulong)uVar8;
  }
  uVar8 = 0;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    if (f[uVar5] < N / 2) {
      local_48[(int)uVar8] = (double)f[uVar5];
      uVar8 = uVar8 + 1;
    }
  }
  local_3c = uVar8;
  local_38 = N;
  pos = (int *)malloc((long)(int)uVar8 * 4);
  sort1d_ascending(local_48,uVar8,pos);
  N_00 = local_38;
  uVar2 = local_3c;
  if ((int)uVar8 < 1) {
    pdVar3 = (double *)malloc(sStack_60);
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)local_38) {
      uVar7 = (ulong)local_38;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pdVar3[uVar5] = (double)(int)uVar5;
    }
    supsmu(pdVar3,local_38,y,(double *)0x0,1,0.0,-1.0,trend);
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      remainder[uVar5] = y[uVar5] - trend[uVar5];
    }
    *local_58 = 0;
    free(pdVar3);
  }
  else {
    local_50 = calloc((long)(int)(local_3c * local_38),8);
    pdVar3 = (double *)calloc(__nmemb,8);
    sVar9 = sStack_60;
    memcpy(pdVar3,y,sStack_60);
    iVar4 = 0;
    uVar5 = 0;
    if (0 < (int)N_00) {
      uVar5 = (ulong)N_00;
    }
    if (local_34 < 1) {
      local_34 = 0;
    }
    for (; iVar4 != local_34; iVar4 = iVar4 + 1) {
      pvVar10 = local_50;
      for (uVar7 = 0; uVar7 != uVar2; uVar7 = uVar7 + 1) {
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          pdVar3[uVar6] = *(double *)((long)pvVar10 + uVar6 * 8) + pdVar3[uVar6];
        }
        dVar1 = local_48[uVar7];
        stl(pdVar3,N_00,(int)dVar1,"null",&local_64,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
            (int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
            (double *)((long)local_50 + uVar7 * __nmemb * 8),trend,remainder);
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          pdVar3[uVar6] = pdVar3[uVar6] - *(double *)((long)pvVar10 + uVar6 * 8);
        }
        f[uVar7] = (int)dVar1;
        pvVar10 = (void *)((long)pvVar10 + sStack_60);
        sVar9 = sStack_60;
        N_00 = local_38;
      }
    }
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      remainder[uVar7] = pdVar3[uVar7] - trend[uVar7];
    }
    pvVar10 = local_50;
    for (uVar7 = 0; uVar7 != uVar2; uVar7 = uVar7 + 1) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        seasonal[uVar7][uVar6] = *(double *)((long)pvVar10 + uVar6 * 8);
      }
      pvVar10 = (void *)((long)pvVar10 + sVar9);
    }
    *local_58 = local_3c;
    free(local_50);
    free(pdVar3);
  }
  free(y);
  free(pos);
  free(local_48);
  return;
}

Assistant:

void mstl(double *x, int N, int *f, int *Nseas, int *s_window,double *lambda,int *iterate, double **seasonal, double *trend,double *remainder) {
    int i,j,k,s_window_,Niter,iterate_,iter,freq;
    double *y,*t,*deseas;
    double *msts,*seas;
    int *pos;

    Niter = 0;

    s_window_ = (s_window == NULL) ? 13 : *s_window;
    iterate_ = (iterate == NULL) ? 2 : *iterate;

    y = (double*)malloc(sizeof(double)*N);

    if (lambda != NULL) {
        boxcox(x,N,lambda,y);
    } else {
        memcpy(y,x,sizeof(double)*N);
    }

    msts = (double*)malloc(sizeof(double)*(*Nseas));

    for(i = 0; i < *Nseas;++i) {
        if (f[i] < N / 2) {
            msts[Niter] = (double) f[i];
            Niter++;
        }
    }

    pos = (int*)malloc(sizeof(int)*Niter);

    sort1d_ascending(msts,Niter,pos);

    if (Niter > 0) {

        seas = (double*)calloc(Niter*N,sizeof(double));
        deseas = (double*)calloc(N,sizeof(double));

        memcpy(deseas,y,sizeof(double)*N);

        for(j = 0; j < iterate_;++j) {
            for(i = 0; i < Niter;++i) {
                iter = i * N;
                for(k = 0; k < N;++k) {
                    deseas[k] += seas[iter+k];
                }
                freq = (int) msts[i];
                stl(deseas,N,freq,"null",&s_window_,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,seas+iter,trend,remainder);
                for(k = 0; k < N;++k) {
                    deseas[k] -= seas[iter+k];
                }
                f[i] = freq;
            }
        }

        for(i = 0; i < N;++i) {
            remainder[i] = deseas[i] - trend[i];
        }
        for(i = 0; i < Niter;++i) {
            iter = i * N;
            for(j = 0; j < N;++j) {
                seasonal[i][j] = seas[iter+j];
            }
        }

        *Nseas = Niter;

        free(seas);
        free(deseas);
    } else {
        t = (double*) malloc(sizeof(double)*N);
        for(i = 0; i < N;++i) {
            t[i] = i;
        }
        supsmu(t,N,y,NULL,1,0,-1.0,trend);
        for(i = 0; i < N;++i) {
            remainder[i] = y[i] - trend[i];
        }
        *Nseas = 0;
        free(t);
    }


    free(y);
    free(pos);
    free(msts);
}